

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall YAML::Emitter::SpaceOrIndentTo(Emitter *this,bool requireSpace,size_t indent)

{
  ostream_wrapper *this_00;
  size_t in_RCX;
  undefined1 local_29;
  
  this_00 = &this->m_stream;
  if ((this->m_stream).m_comment == true) {
    ostream_wrapper::write(this_00,0x76ce52,(void *)0x1,in_RCX);
  }
  if (requireSpace && (this->m_stream).m_col != 0) {
    ostream_wrapper::write(this_00,0x760a54,(void *)0x1,in_RCX);
  }
  if ((this->m_stream).m_col < indent) {
    do {
      local_29 = 0x20;
      ostream_wrapper::write(this_00,(int)&local_29,(void *)0x1,in_RCX);
    } while ((this->m_stream).m_col < indent);
  }
  return;
}

Assistant:

void Emitter::SpaceOrIndentTo(bool requireSpace, std::size_t indent) {
  if (m_stream.comment())
    m_stream << "\n";
  if (m_stream.col() > 0 && requireSpace)
    m_stream << " ";
  m_stream << IndentTo(indent);
}